

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_file_get_contents(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  uint uVar2;
  jx9_io_stream *pStream_00;
  jx9_int64 jVar3;
  ulong local_20a8;
  jx9_value *local_2088;
  int local_2064;
  void *pvStack_2060;
  int nLen;
  void *pHandle;
  char zBuf [8192];
  char *zFile;
  ulong uStack_48;
  int use_include;
  jx9_int64 nMaxlen;
  jx9_int64 nRead;
  jx9_int64 n;
  jx9_io_stream *pStream;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zFile._4_4_ = 0;
  if ((nArg < 1) || (iVar1 = jx9_value_is_string(*apArg), iVar1 == 0)) {
    jx9_context_throw_error(pCtx,2,"Expecting a file path");
    jx9_result_bool(pCtx,0);
  }
  else {
    zBuf._8184_8_ = jx9_value_to_string(*apArg,&local_2064);
    pStream_00 = jx9VmGetStreamDevice(pCtx->pVm,(char **)(zBuf + 0x1ff8),local_2064);
    if (pStream_00 == (jx9_io_stream *)0x0) {
      jx9_context_throw_error(pCtx,2,"No such stream device, JX9 is returning FALSE");
      jx9_result_bool(pCtx,0);
    }
    else {
      uStack_48 = 0xffffffffffffffff;
      if (1 < nArg) {
        zFile._4_4_ = jx9_value_to_bool(apArg[1]);
      }
      if (nArg < 3) {
        local_2088 = (jx9_value *)0x0;
      }
      else {
        local_2088 = apArg[2];
      }
      pvStack_2060 = jx9StreamOpenHandle(pCtx->pVm,pStream_00,(char *)zBuf._8184_8_,1,zFile._4_4_,
                                         local_2088,0,(int *)0x0);
      if (pvStack_2060 == (void *)0x0) {
        jx9_context_throw_error_format(pCtx,1,"IO error while opening \'%s\'",zBuf._8184_8_);
        jx9_result_bool(pCtx,0);
      }
      else {
        if (3 < nArg) {
          jVar3 = jx9_value_to_int64(apArg[3]);
          if ((0 < jVar3) && (pStream_00->xSeek != (_func_int_void_ptr_jx9_int64_int *)0x0)) {
            (*pStream_00->xSeek)(pvStack_2060,jVar3,0);
          }
          if (4 < nArg) {
            uStack_48 = jx9_value_to_int64(apArg[4]);
          }
        }
        nMaxlen = 0;
        do {
          if (((long)uStack_48 < 1) || (0x1fff < uStack_48)) {
            local_20a8 = 0x2000;
          }
          else {
            local_20a8 = uStack_48;
          }
          jVar3 = (*pStream_00->xRead)(pvStack_2060,&pHandle,local_20a8);
          if (jVar3 < 1) break;
          jx9_result_string(pCtx,(char *)&pHandle,(int)jVar3);
          nMaxlen = jVar3 + nMaxlen;
        } while (((long)uStack_48 < 1) || (nMaxlen < (long)uStack_48));
        jx9StreamCloseHandle(pStream_00,pvStack_2060);
        uVar2 = jx9_context_result_buf_length(pCtx);
        if (uVar2 == 0) {
          jx9_result_bool(pCtx,0);
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_file_get_contents(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	jx9_int64 n, nRead, nMaxlen;
	int use_include  = FALSE;
	const char *zFile;
	char zBuf[8192];
	void *pHandle;
	int nLen;
	
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting a file path");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the file path */
	zFile = jx9_value_to_string(apArg[0], &nLen);
	/* Point to the target IO stream device */
	pStream = jx9VmGetStreamDevice(pCtx->pVm, &zFile, nLen);
	if( pStream == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "No such stream device, JX9 is returning FALSE");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	nMaxlen = -1;
	if( nArg > 1 ){
		use_include = jx9_value_to_bool(apArg[1]);
	}
	/* Try to open the file in read-only mode */
	pHandle = jx9StreamOpenHandle(pCtx->pVm, pStream, zFile, JX9_IO_OPEN_RDONLY, use_include, nArg > 2 ? apArg[2] : 0, FALSE, 0);
	if( pHandle == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, "IO error while opening '%s'", zFile);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	if( nArg > 3 ){
		/* Extract the offset */
		n = jx9_value_to_int64(apArg[3]);
		if( n > 0 ){
			if( pStream->xSeek ){
				/* Seek to the desired offset */
				pStream->xSeek(pHandle, n, 0/*SEEK_SET*/);
			}
		}
		if( nArg > 4 ){
			/* Maximum data to read */
			nMaxlen = jx9_value_to_int64(apArg[4]);
		}
	}
	/* Perform the requested operation */
	nRead = 0;
	for(;;){
		n = pStream->xRead(pHandle, zBuf, 
			(nMaxlen > 0 && (nMaxlen < sizeof(zBuf))) ? nMaxlen : sizeof(zBuf));
		if( n < 1 ){
			/* EOF or IO error, break immediately */
			break;
		}
		/* Append data */
		jx9_result_string(pCtx, zBuf, (int)n);
		/* Increment read counter */
		nRead += n;
		if( nMaxlen > 0 && nRead >= nMaxlen ){
			/* Read limit reached */
			break;
		}
	}
	/* Close the stream */
	jx9StreamCloseHandle(pStream, pHandle);
	/* Check if we have read something */
	if( jx9_context_result_buf_length(pCtx) < 1 ){
		/* Nothing read, return FALSE */
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}